

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

void __thiscall
axl::sl::ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::attach
          (ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,Hdr *hdr,
          unsigned_long *p,size_t count)

{
  int32_t *piVar1;
  FreeFunc *pFVar2;
  Hdr *pHVar3;
  
  pHVar3 = this->m_hdr;
  if (pHVar3 != hdr) {
    if (hdr != (Hdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      pHVar3 = this->m_hdr;
    }
    if (pHVar3 != (Hdr *)0x0) {
      LOCK();
      piVar1 = &(pHVar3->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pHVar3->super_RefCount)._vptr_RefCount)(pHVar3);
        LOCK();
        piVar1 = &(pHVar3->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar2 = (pHVar3->super_RefCount).m_freeFunc, pFVar2 != (FreeFunc *)0x0)) {
          (*pFVar2)(pHVar3);
        }
      }
    }
    this->m_hdr = hdr;
  }
  this->m_p = p;
  this->m_count = count;
  return;
}

Assistant:

void
	attach(
		Hdr* hdr,
		T* p,
		size_t count
	) {
		if (hdr != m_hdr) { // try to avoid unnecessary interlocked ops
			if (hdr)
				hdr->addRef();

			if (m_hdr)
				m_hdr->release();

			m_hdr = hdr;
		}

		m_p = p;
		m_count = count;
	}